

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O2

void bf_read_buffer(bfile_t *bfile)

{
  size_t sVar1;
  ulong uVar2;
  
  if (bfile->progress_cb != (_func_int_float_void_ptr *)0x0) {
    (*bfile->progress_cb)((float)bfile->ipos / (float)bfile->size,bfile->progress_data);
  }
  if (bfile->ipos != bfile->size) {
    uVar2 = 0;
    while ((sVar1 = bfile->buffer_size - uVar2, uVar2 <= bfile->buffer_size && sVar1 != 0 &&
           (bfile->ipos < bfile->size))) {
      sVar1 = fread(bfile->buffer + uVar2,1,sVar1,(FILE *)bfile->file);
      if (sVar1 == 0) {
        fwrite("Error: fread() returned 0.\n",0x1b,1,_stderr);
      }
      else {
        uVar2 = uVar2 + sVar1;
        bfile->ipos = bfile->ipos + sVar1;
      }
    }
  }
  return;
}

Assistant:

static
void
bf_read_buffer(
    bfile_t * bfile )
{
    size_t bytes;

    if ( bfile->progress_cb ) {
        bfile->progress_cb( (float)bfile->ipos / (float)bfile->size,
            bfile->progress_data);
    }

    if ( bfile->ipos == bfile->size )
        /* file completely read */
        return;

    bytes = 0;
    while ( (bytes < bfile->buffer_size) && (bfile->ipos < bfile->size) ) {
        size_t b;
        b = fread( bfile->buffer + bytes, 1, bfile->buffer_size - bytes,
                   bfile->file );
        if ( b != 0 ) {
            bytes += b;
            bfile->ipos += b;
        } else {
            fprintf( stderr, "Error: fread() returned 0.\n" );
        }
    }
}